

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_set.cc
# Opt level: O0

int X509_set1_notAfter(X509 *x,ASN1_TIME *tm)

{
  ASN1_STRING *local_28;
  ASN1_TIME *in;
  ASN1_TIME *tm_local;
  X509 *x_local;
  
  if ((x == (X509 *)0x0) || (x->cert_info->validity == (X509_VAL *)0x0)) {
    x_local._4_4_ = 0;
  }
  else {
    local_28 = (ASN1_STRING *)x->cert_info->validity->notAfter;
    if ((local_28 != (ASN1_STRING *)tm) &&
       (local_28 = ASN1_STRING_dup((ASN1_STRING *)tm), local_28 != (ASN1_STRING *)0x0)) {
      ASN1_TIME_free((ASN1_TIME *)x->cert_info->validity->notAfter);
      x->cert_info->validity->notAfter = (ASN1_TIME *)local_28;
    }
    x_local._4_4_ = (uint)(local_28 != (ASN1_STRING *)0x0);
  }
  return x_local._4_4_;
}

Assistant:

int X509_set1_notAfter(X509 *x, const ASN1_TIME *tm) {
  ASN1_TIME *in;

  if ((x == NULL) || (x->cert_info->validity == NULL)) {
    return 0;
  }
  in = x->cert_info->validity->notAfter;
  if (in != tm) {
    in = ASN1_STRING_dup(tm);
    if (in != NULL) {
      ASN1_TIME_free(x->cert_info->validity->notAfter);
      x->cert_info->validity->notAfter = in;
    }
  }
  return in != NULL;
}